

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O2

int ffflsh(fitsfile *fptr,int clearbuf,int *status)

{
  int *piVar1;
  FITSfile *Fptr;
  int iVar2;
  long lVar3;
  
  for (lVar3 = -0x28; lVar3 != 0; lVar3 = lVar3 + 1) {
    Fptr = fptr->Fptr;
    if ((-1 < *(long *)(Fptr->dirty + lVar3 * 2)) && (Fptr->ageindex[lVar3] != 0)) {
      ffbfwt(Fptr,(int)lVar3 + 0x28,status);
    }
    if (clearbuf != 0) {
      piVar1 = fptr->Fptr->dirty + lVar3 * 2;
      piVar1[0] = -1;
      piVar1[1] = -1;
    }
  }
  if (*status == 0x70) {
    iVar2 = 0x70;
  }
  else {
    ffflushx(fptr->Fptr);
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffflsh(fitsfile *fptr,        /* I - FITS file pointer           */
           int clearbuf,          /* I - also clear buffer contents? */
           int *status)           /* IO - error status               */
{
/*
  flush all dirty IO buffers associated with the file to disk
*/
    int ii;

/*
   no need to move to a different HDU

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
*/
    for (ii = 0; ii < NIOBUF; ii++)
    {
	/* flush modified buffer to disk */
        if ((fptr->Fptr)->bufrecnum[ii] >= 0 &&(fptr->Fptr)->dirty[ii])
           ffbfwt(fptr->Fptr, ii, status);

        if (clearbuf)
          (fptr->Fptr)->bufrecnum[ii] = -1;  /* set contents of buffer as undefined */
    }

    if (*status != READONLY_FILE)
      ffflushx(fptr->Fptr);  /* flush system buffers to disk */

    return(*status);
}